

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O2

void slider_range(t_slider *x,t_symbol *s,int ac,t_atom *av)

{
  t_float tVar1;
  t_float tVar2;
  
  tVar1 = atom_getfloatarg(0,ac,av);
  tVar2 = atom_getfloatarg(1,ac,av);
  slider_check_minmax(x,(double)tVar1,(double)tVar2,
                      (float)*(int *)((x->x_gui).x_font +
                                     (ulong)(x->x_orientation == horizontal) * 4 + -0x18));
  slider_set(x,x->x_fval);
  return;
}

Assistant:

static void slider_range(t_slider *x, t_symbol *s, int ac, t_atom *av)
{
    slider_check_minmax(x,
        (double)atom_getfloatarg(0, ac, av),
        (double)atom_getfloatarg(1, ac, av),
        (x->x_orientation==horizontal)?x->x_gui.x_w:x->x_gui.x_h);
    slider_set(x, x->x_fval);
}